

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisDecoderDecodeInstruction
          (ZydisDecoder *decoder,ZydisDecoderContext *context,void *buffer,ZyanUSize length,
          ZydisDecodedInstruction *instruction)

{
  uint uVar1;
  uint uVar2;
  undefined7 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  byte bVar7;
  ZyanStatus ZVar8;
  ulong uVar9;
  byte bVar10;
  ZyanU8 ZVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  ZydisDecoderContext *pZVar17;
  ulong uVar18;
  uint in_R10D;
  ZyanU8 *pZVar19;
  ZyanUSize ZVar20;
  bool bVar21;
  byte local_d2;
  byte local_d1;
  byte local_d0;
  byte local_cf;
  ZyanBool local_ce;
  byte local_cd;
  byte local_cc;
  byte local_cb;
  byte local_ca;
  byte local_c9;
  uint local_c8;
  uint local_c4;
  ZydisDecoderState local_c0;
  uint local_90;
  ZydisMachineMode local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ZydisDecoderContext *local_58;
  ZydisDecoderContext default_context;
  
  ZVar8 = 0x80100004;
  if ((instruction != (ZydisDecodedInstruction *)0x0 && decoder != (ZydisDecoder *)0x0) &&
     (ZVar8 = 0x80200000, length != 0 && buffer != (void *)0x0)) {
    local_c0.prefixes.has_lock = '\0';
    local_c0.prefixes.group1 = '\0';
    local_c0.prefixes.group2 = '\0';
    local_c0.prefixes.effective_segment = '\0';
    local_c0.prefixes.mandatory_candidate = '\0';
    local_c0.prefixes.offset_lock = '\0';
    local_c0.prefixes.offset_group1 = '\0';
    local_c0.prefixes.offset_group2 = '\0';
    local_c0.context = context;
    if (context == (ZydisDecoderContext *)0x0) {
      local_c0.context = &default_context;
    }
    local_c0.prefixes.offset_osz_override = '\0';
    local_c0.prefixes.offset_asz_override = '\0';
    local_c0.prefixes.offset_segment = '\0';
    local_c0.prefixes.offset_mandatory = '\0';
    local_c0.prefixes.offset_notrack = -1;
    local_c0._45_3_ = 0;
    *(undefined8 *)&((local_c0.context)->vector_unified).R2 = 0;
    *(undefined8 *)&((local_c0.context)->reg_info).id_base = 0;
    (local_c0.context)->definition = (void *)0x0;
    (local_c0.context)->eosz_index = '\0';
    (local_c0.context)->easz_index = '\0';
    ((local_c0.context)->vector_unified).W = '\0';
    ((local_c0.context)->vector_unified).R = '\0';
    ((local_c0.context)->vector_unified).X = '\0';
    ((local_c0.context)->vector_unified).B = '\0';
    ((local_c0.context)->vector_unified).L = '\0';
    ((local_c0.context)->vector_unified).LL = '\0';
    local_80 = 0;
    local_c0.decoder = decoder;
    local_c0.buffer = (ZyanU8 *)buffer;
    local_c0.buffer_len = length;
    local_58 = context;
    memset(instruction,0,0x168);
    uVar4 = local_c0._40_8_;
    local_8c = decoder->machine_mode;
    instruction->machine_mode = local_8c;
    instruction->stack_width = (ZyanU8)(0x10 << ((char)decoder->stack_width & 0x1f));
    local_cf = local_c0.prefixes.offset_asz_override;
    local_d0 = local_c0.prefixes.offset_osz_override;
    local_c8 = (uint)local_c0.prefixes.mandatory_candidate;
    local_c4 = (uint)local_c0.prefixes.offset_mandatory;
    local_d2 = local_c0.prefixes.group2;
    local_d1 = local_c0.prefixes.offset_group2;
    local_ca = local_c0.prefixes.effective_segment;
    local_c9 = local_c0.prefixes.offset_segment;
    uVar18 = (ulong)local_c0._40_8_ >> 0x20 & 0xff;
    local_cc = local_c0.prefixes.group1;
    local_cb = local_c0.prefixes.offset_group1;
    local_ce = local_c0.prefixes.has_lock;
    local_cd = local_c0.prefixes.offset_lock;
    local_78 = 0;
    uVar9 = 0;
    local_68 = 0;
    local_70 = 0;
    local_88 = 0;
    local_60 = 0;
    local_90 = 0;
    uVar16 = 0;
    uVar14 = 0;
    pZVar19 = (ZyanU8 *)buffer;
    ZVar20 = length;
    while( true ) {
      bVar7 = (byte)uVar14;
      if (0xe < bVar7) break;
      if (length == uVar14) {
        return 0x80200000;
      }
      bVar10 = *(byte *)((long)buffer + uVar14);
      in_R10D = CONCAT31((int3)(in_R10D >> 8),bVar10);
      uVar2 = (uint)bVar10;
      uVar1 = uVar2 - 0x26;
      bVar15 = (byte)uVar16;
      if (uVar1 < 0x40) {
        if ((0x1010101UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
          if ((0xc000000000000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_00107a48;
        }
        else if (local_8c == ZYDIS_MACHINE_MODE_LONG_64) {
          uVar13 = uVar18 & 0xff;
          uVar18 = uVar14 & 0xffffffff;
          if (((byte)local_60 & 0xfe) == 100) {
            uVar18 = uVar13;
          }
          if (bVar10 != 0x3e) {
            uVar18 = uVar13;
          }
          local_80 = uVar14 & 0xffffffff;
          local_78 = (ulong)in_R10D;
          local_d2 = bVar10;
          local_d1 = bVar7;
          goto LAB_00107b24;
        }
        uVar18 = 0xff;
        local_80 = (ulong)CONCAT31((int3)(uVar1 >> 8),bVar7);
        local_78 = (ulong)in_R10D;
        local_60 = (ulong)in_R10D;
        local_d2 = bVar10;
        local_d1 = bVar7;
        local_ca = bVar10;
        local_c9 = bVar7;
LAB_00107b24:
        if (bVar15 != bVar10 && bVar15 != 0) {
          uVar9 = 0;
          uVar16 = 0;
          goto LAB_00107b3a;
        }
      }
      else {
LAB_00107a48:
        if (uVar2 - 0xf2 < 2) {
          local_c4 = (uint)uVar14 & 0xff;
          local_cc = bVar10;
          local_cb = bVar7;
          local_c8 = in_R10D;
          local_90 = in_R10D;
          goto LAB_00107b24;
        }
        if (uVar2 == 0x66) {
          bVar21 = (char)local_90 == '\0';
          local_c4 = local_c4 & 0xff;
          if (bVar21) {
            local_c4 = (uint)uVar14;
          }
          local_c8 = local_c8 & 0xff;
          if (bVar21) {
            local_c8 = 0x66;
          }
          local_90 = local_90 & 0xff;
          if (bVar21) {
            local_90 = 0x66;
          }
          local_88 = local_88 | 0x80000000000;
          instruction->attributes = local_88;
          local_70 = uVar14 & 0xff;
          local_d0 = bVar7;
          goto LAB_00107b24;
        }
        if (uVar2 == 0x67) {
          local_88 = local_88 | 0x100000000000;
          instruction->attributes = local_88;
          local_68 = uVar14 & 0xffffffff;
          local_cf = bVar7;
          goto LAB_00107b24;
        }
        if (uVar2 == 0xf0) {
          local_ce = '\x01';
          local_cd = bVar7;
          goto LAB_00107b24;
        }
        if ((local_8c != ZYDIS_MACHINE_MODE_LONG_64) || ((bVar10 & 0xf0) != 0x40)) {
          local_c0.prefixes.offset_asz_override = local_cf;
          local_c0.prefixes.offset_osz_override = local_d0;
          local_c0.prefixes._0_8_ = (ulong)(byte)local_c8 << 0x20;
          local_c0.prefixes._0_7_ = (uint7)CONCAT51(local_c0.prefixes._3_5_,local_d2) << 0x10;
          uVar3 = local_c0.prefixes._0_7_;
          local_c0.prefixes.offset_group2 = local_d1;
          local_c0.prefixes._0_3_ = SUB73(uVar3,0);
          local_c0.prefixes.effective_segment = local_ca;
          local_c0.prefixes.offset_segment = local_c9;
          local_c0.prefixes.offset_mandatory = (char)local_c4;
          uVar6 = local_c0.prefixes._8_4_;
          local_c0._45_3_ = SUB83(uVar4,5);
          local_c0.prefixes.offset_notrack = (ZyanI8)uVar18;
          local_c0.prefixes._0_6_ = (int6)CONCAT61(local_c0.prefixes._2_6_,local_cc) << 8;
          local_c0.prefixes.offset_group1 = local_cb;
          uVar4 = local_c0.prefixes._0_8_;
          local_c0.prefixes.has_lock = local_ce;
          uVar5 = local_c0.prefixes._0_8_;
          local_c0.prefixes._6_2_ = SUB82(uVar4,6);
          local_c0.prefixes._0_5_ = SUB85(uVar5,0);
          local_c0.prefixes.offset_lock = local_cd;
          if ((local_88 & 0x80000000000) != 0) {
            (instruction->raw).prefixes[local_70].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          if ((local_88 & 0x100000000000) != 0) {
            (instruction->raw).prefixes[local_68 & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          if (bVar15 != 0) {
            (instruction->raw).prefixes[uVar9 & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
            if ((bVar15 & 0xf0) != 0x40) {
              __assert_fail("(data & 0xF0) == 0x40",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x17a,
                            "void ZydisDecodeREX(ZydisDecoderContext *, ZydisDecodedInstruction *, ZyanU8)"
                           );
            }
            bVar7 = bVar15 >> 3 & 1;
            bVar10 = bVar15 >> 2 & 1;
            bVar12 = bVar15 >> 1 & 1;
            instruction->attributes = local_88 | 4;
            (instruction->raw).rex.W = bVar7;
            (instruction->raw).rex.R = bVar10;
            (instruction->raw).rex.X = bVar12;
            (instruction->raw).rex.B = bVar15 & 1;
            pZVar17 = &default_context;
            if (local_58 != (ZydisDecoderContext *)0x0) {
              pZVar17 = local_58;
            }
            (pZVar17->vector_unified).W = bVar7;
            (pZVar17->vector_unified).R = bVar10;
            (pZVar17->vector_unified).X = bVar12;
            (pZVar17->vector_unified).B = bVar15 & 1;
          }
          if ((local_8c != ZYDIS_MACHINE_MODE_LONG_64) && ((char)local_78 == '>')) {
            local_c0.prefixes.offset_notrack = (ZyanI8)local_80;
            local_c0.prefixes._8_5_ = CONCAT14(local_c0.prefixes.offset_notrack,uVar6);
          }
          ZVar8 = ZydisDecodeInstruction(&local_c0,instruction);
          if (-1 < (int)ZVar8) {
            return 0x100000;
          }
          return ZVar8;
        }
        uVar9 = uVar14 & 0xffffffff;
        uVar16 = in_R10D;
LAB_00107b3a:
        (instruction->raw).rex.offset = (ZyanU8)uVar9;
      }
      ZVar11 = (ZyanU8)(uVar14 + 1);
      (instruction->raw).prefix_count = ZVar11;
      (instruction->raw).prefixes[uVar14].value = bVar10;
      instruction->length = ZVar11;
      local_c0.buffer = pZVar19 + 1;
      local_c0.buffer_len = ZVar20 - 1;
      uVar14 = uVar14 + 1;
      pZVar19 = local_c0.buffer;
      ZVar20 = local_c0.buffer_len;
    }
    ZVar8 = 0x80200002;
  }
  return ZVar8;
}

Assistant:

ZyanStatus ZydisDecoderDecodeInstruction(const ZydisDecoder* decoder, ZydisDecoderContext* context,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction)
{
    if (!decoder || !instruction)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!buffer || !length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }

    ZydisDecoderState state;
    ZYAN_MEMSET(&state, 0, sizeof(state));
    state.decoder = decoder;
    state.buffer = (const ZyanU8*)buffer;
    state.buffer_len = length;
    state.prefixes.offset_notrack = -1;

    ZydisDecoderContext default_context;
    if (!context)
    {
        // Use a fallback context if no custom one has been provided
        context = &default_context;
    }
    ZYAN_MEMSET(context, 0, sizeof(*context));
    state.context = context;

    ZYAN_MEMSET(instruction, 0, sizeof(*instruction));
    instruction->machine_mode = decoder->machine_mode;
    instruction->stack_width = 16 << decoder->stack_width;

    ZYAN_CHECK(ZydisCollectOptionalPrefixes(&state, instruction));
    ZYAN_CHECK(ZydisDecodeInstruction(&state, instruction));

    return ZYAN_STATUS_SUCCESS;
}